

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O0

uint64_t aom_mse_wxh_16bit_highbd_avx2
                   (uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  int in_R8D;
  int in_stack_000001c0;
  int in_stack_000001c4;
  uint16_t *in_stack_000001c8;
  int in_stack_000001d4;
  uint16_t *in_stack_000001d8;
  int in_stack_00000200;
  int in_stack_00000204;
  uint16_t *in_stack_00000208;
  int in_stack_00000214;
  uint16_t *in_stack_00000218;
  undefined8 local_8;
  
  if (in_R8D == 4) {
    local_8 = mse_4xh_16bit_highbd_avx2
                        (in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000204,
                         in_stack_00000200);
  }
  else if (in_R8D == 8) {
    local_8 = mse_8xh_16bit_highbd_avx2
                        (in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,in_stack_000001c4,
                         in_stack_000001c0);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_avx2(uint16_t *dst, int dstride,
                                       uint16_t *src, int sstride, int w,
                                       int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}